

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O3

fasttext_vocab_t * cft_fasttext_get_vocab(fasttext_t *handle)

{
  pointer plVar1;
  fasttext_vocab_t *pfVar2;
  _Alloc_hider _Var3;
  char **ppcVar4;
  int64_t *piVar5;
  char *pcVar6;
  size_t __size;
  pointer plVar7;
  ulong uVar8;
  vector<long,_std::allocator<long>_> vocab_freq;
  shared_ptr<const_fasttext::Dictionary> d;
  string word;
  vector<long,_std::allocator<long>_> local_80;
  fasttext_vocab_t *local_68;
  Dictionary *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  fasttext::FastText::getDictionary((FastText *)handle);
  fasttext::Dictionary::getCounts(&local_80,local_60,word);
  plVar1 = local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar7 = local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  __size = (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_68 = (fasttext_vocab_t *)malloc(0x18);
  local_68->length = (long)__size >> 3;
  ppcVar4 = (char **)malloc(__size);
  piVar5 = (int64_t *)malloc(__size);
  if (plVar1 != plVar7) {
    uVar8 = 0;
    do {
      fasttext::Dictionary::getWord_abi_cxx11_(&local_50,local_60,(int32_t)uVar8);
      _Var3._M_p = local_50._M_dataplus._M_p;
      pcVar6 = strdup(local_50._M_dataplus._M_p);
      ppcVar4[uVar8] = pcVar6;
      piVar5[uVar8] =
           local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar8];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_50.field_2) {
        operator_delete(_Var3._M_p);
      }
      uVar8 = uVar8 + 1;
      plVar7 = local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3));
  }
  pfVar2 = local_68;
  local_68->words = ppcVar4;
  local_68->freqs = piVar5;
  if (plVar7 != (pointer)0x0) {
    operator_delete(plVar7);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return pfVar2;
}

Assistant:

fasttext_vocab_t* cft_fasttext_get_vocab(fasttext_t* handle) {
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::vector<int64_t> vocab_freq = d->getCounts(fasttext::entry_type::word);
    size_t len = vocab_freq.size();

    fasttext_vocab_t* ret = static_cast<fasttext_vocab_t*>(malloc(sizeof(fasttext_vocab_t)));
    ret->length = len;
    char** words = static_cast<char**>(malloc(sizeof(char*) * len));
    int64_t* freqs = static_cast<int64_t*>(malloc(sizeof(int64_t) * len));
    for (int32_t i = 0; i < vocab_freq.size(); i++) {
        std::string word = d->getWord(i);
        words[i] = strdup(word.c_str());
        freqs[i] = vocab_freq[i];
    }
    ret->words = words;
    ret->freqs = freqs;
    return ret;
}